

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlogging.cpp
# Opt level: O3

void qt_message_print(QtMsgType msgType,QMessageLogContext *context,QString *message)

{
  undefined1 *puVar1;
  bool bVar2;
  int iVar3;
  QLoggingCategory *this;
  code *pcVar4;
  undefined1 auVar5 [16];
  
  if (((msgType != QtFatalMsg) &&
      (((context->category == (char *)0x0 ||
        (iVar3 = strcmp(context->category,"default"), iVar3 == 0)) &&
       (this = QLoggingCategory::defaultCategory(), this != (QLoggingCategory *)0x0)))) &&
     (bVar2 = QLoggingCategory::isEnabled(this,msgType), !bVar2)) {
    return;
  }
  auVar5 = __tls_get_addr(&PTR_006a9338);
  if (*(char *)(auVar5._0_8_ + 0x28) == '\0') {
    puVar1 = (undefined1 *)(auVar5._0_8_ + 0x28);
    *puVar1 = 1;
    pcVar4 = qDefaultMessageHandler;
    if (messageHandler._q_value._M_b._M_p != (__base_type)0x0) {
      pcVar4 = (code *)messageHandler;
    }
    (*pcVar4)(msgType,context,message);
    *puVar1 = 0;
    return;
  }
  stderr_message_handler
            ((QtMsgType)(message->d).ptr,(QMessageLogContext *)(message->d).size,auVar5._8_8_);
  return;
}

Assistant:

static void qt_message_print(QtMsgType msgType, const QMessageLogContext &context, const QString &message)
{
    Q_TRACE(qt_message_print, msgType, context.category, context.function, context.file, context.line, message);

    // qDebug, qWarning, ... macros do not check whether category is enabledgc
    if (msgType != QtFatalMsg && isDefaultCategory(context.category)) {
        if (QLoggingCategory *defaultCategory = QLoggingCategory::defaultCategory()) {
            if (!defaultCategory->isEnabled(msgType))
                return;
        }
    }

    // prevent recursion in case the message handler generates messages
    // itself, e.g. by using Qt API
    if (grabMessageHandler()) {
        const auto ungrab = qScopeGuard([]{ ungrabMessageHandler(); });
        auto msgHandler = messageHandler.loadAcquire();
        (msgHandler ? msgHandler : qDefaultMessageHandler)(msgType, context, message);
    } else {
        stderr_message_handler(msgType, context, message);
    }
}